

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintStamp.hpp
# Opt level: O2

void __thiscall
OpenMD::ConstraintStamp::setMembers
          (ConstraintStamp *this,vector<int,_std::allocator<int>_> *members)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  OpenMDException *pOVar5;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  string local_1b0;
  ostringstream oss;
  
  piVar3 = (members->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((long)(members->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_finish - (long)piVar3 != 8) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"ConstraintStamp Error: members");
    containerToString<std::vector<int,std::allocator<int>>>(&local_1b0,(OpenMD *)members,cont);
    poVar4 = std::operator<<(poVar4,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4," is invalid");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_1b0);
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    OpenMDException::OpenMDException(pOVar5,&local_1b0);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  iVar1 = *piVar3;
  this->a = iVar1;
  iVar2 = piVar3[1];
  this->b = iVar2;
  if ((-1 < iVar1) && (-1 < iVar2)) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"ConstraintStamp Error: members");
  containerToString<std::vector<int,std::allocator<int>>>(&local_1b0,(OpenMD *)members,cont_00);
  poVar4 = std::operator<<(poVar4,(string *)&local_1b0);
  poVar4 = std::operator<<(poVar4," is invalid");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_1b0);
  pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar5,&local_1b0);
  __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void setMembers(std::vector<int> members) {
      if (members.size() == 2) {
        a = members[0];
        b = members[1];
        if (a < 0 || b < 0) {
          std::ostringstream oss;
          oss << "ConstraintStamp Error: members" << containerToString(members)
              << " is invalid" << std::endl;
          throw OpenMDException(oss.str());
        }
      } else {
        std::ostringstream oss;
        oss << "ConstraintStamp Error: members" << containerToString(members)
            << " is invalid" << std::endl;
        throw OpenMDException(oss.str());
      }
    }